

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bsetstr(bstring b0,int pos,const_bstring b1,uchar fill)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  bstring local_40;
  
  iVar4 = -1;
  if (((b0 != (bstring)0x0 && -1 < pos) && (-1 < b0->slen)) && (b0->data != (uchar *)0x0)) {
    uVar3 = b0->mlen;
    if (0 < (int)uVar3 && b0->slen <= (int)uVar3) {
      if (b1 == (const_bstring)0x0) {
        local_40 = (bstring)0x0;
        uVar2 = (ulong)(uint)pos;
      }
      else {
        if (b1->slen < 0) {
          return -1;
        }
        if (b1->data == (uchar *)0x0) {
          return -1;
        }
        local_40 = b1;
        if (((ulong)((long)b1->data - (long)b0->data) < (ulong)uVar3) &&
           (local_40 = bstrcpy(b1), local_40 == (bstring)0x0)) {
          return -1;
        }
        uVar2 = (ulong)(uint)(local_40->slen + pos);
      }
      iVar1 = balloc(b0,(int)uVar2 + 1);
      if (iVar1 == 0) {
        uVar3 = b0->slen;
        if (pos - uVar3 != 0 && (int)uVar3 <= pos) {
          memset(b0->data + (int)uVar3,(uint)fill,(long)(int)(pos - uVar3));
          uVar3 = pos;
        }
        if (local_40 != (bstring)0x0) {
          if (0 < (long)local_40->slen) {
            memmove(b0->data + (uint)pos,local_40->data,(long)local_40->slen);
          }
          if (local_40 != b1) {
            bdestroy(local_40);
          }
        }
        uVar5 = (ulong)uVar3;
        if ((int)uVar3 < (int)uVar2) {
          uVar5 = uVar2;
        }
        b0->slen = (int)uVar5;
        b0->data[uVar5] = '\0';
        iVar4 = 0;
      }
      else if (local_40 != b1) {
        bdestroy(local_40);
      }
    }
  }
  return iVar4;
}

Assistant:

int bsetstr (bstring b0, int pos, const_bstring b1, unsigned char fill) {
int d, newlen;
ptrdiff_t pd;
bstring aux = (bstring) b1;

	if (pos < 0 || b0 == NULL || b0->slen < 0 || NULL == b0->data ||
	    b0->mlen < b0->slen || b0->mlen <= 0) return BSTR_ERR;
	if (b1 != NULL && (b1->slen < 0 || b1->data == NULL)) return BSTR_ERR;

	d = pos;

	/* Aliasing case */
	if (NULL != aux) {
		if ((pd = (ptrdiff_t) (b1->data - b0->data)) >= 0 &&
		    pd < (ptrdiff_t) b0->mlen) {
			if (NULL == (aux = bstrcpy (b1))) return BSTR_ERR;
		}
		d += aux->slen;
	}

	/* Increase memory size if necessary */
	if (balloc (b0, d + 1) != BSTR_OK) {
		if (aux != b1) bdestroy (aux);
		return BSTR_ERR;
	}

	newlen = b0->slen;

	/* Fill in "fill" character as necessary */
	if (pos > newlen) {
		bstr__memset (b0->data + b0->slen, (int) fill,
		              (size_t) (pos - b0->slen));
		newlen = pos;
	}

	/* Copy b1 to position pos in b0. */
	if (aux != NULL) {
		bBlockCopy ((char *) (b0->data + pos), (char *) aux->data, aux->slen);
		if (aux != b1) bdestroy (aux);
	}

	/* Indicate the potentially increased size of b0 */
	if (d > newlen) newlen = d;

	b0->slen = newlen;
	b0->data[newlen] = (unsigned char) '\0';

	return BSTR_OK;
}